

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p::sPolynomial33
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xc50];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8c1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xcb0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8f1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xce0] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0x851];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x921] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0x911] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd10] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9b1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xda0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9e1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xdd0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa11] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xa01] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe00] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa41] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe30] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa71] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe60] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xaa1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe90] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xc51] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xc41] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd11] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd01] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xda1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xec0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xdd1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xef0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe01] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xdf1] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf20] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe31] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe21] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf50] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe61] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe51] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf80] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe91] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe81] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfb0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf21] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf11] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf51] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf41] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf81] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf71] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xfb1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfa1] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfe0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xfe1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfd1] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial33( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(33,46) = -groebnerMatrix(32,67)/(groebnerMatrix(32,65));
  groebnerMatrix(33,47) = -groebnerMatrix(32,68)/(groebnerMatrix(32,65));
  groebnerMatrix(33,48) = (groebnerMatrix(17,48)/(groebnerMatrix(17,44))-groebnerMatrix(32,69)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,51) = -groebnerMatrix(32,72)/(groebnerMatrix(32,65));
  groebnerMatrix(33,52) = -groebnerMatrix(32,73)/(groebnerMatrix(32,65));
  groebnerMatrix(33,53) = (groebnerMatrix(17,53)/(groebnerMatrix(17,44))-groebnerMatrix(32,74)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,54) = -groebnerMatrix(32,75)/(groebnerMatrix(32,65));
  groebnerMatrix(33,55) = -groebnerMatrix(32,76)/(groebnerMatrix(32,65));
  groebnerMatrix(33,56) = -groebnerMatrix(32,77)/(groebnerMatrix(32,65));
  groebnerMatrix(33,65) = groebnerMatrix(17,65)/(groebnerMatrix(17,44));
  groebnerMatrix(33,69) = groebnerMatrix(17,69)/(groebnerMatrix(17,44));
  groebnerMatrix(33,72) = -groebnerMatrix(32,78)/(groebnerMatrix(32,65));
  groebnerMatrix(33,73) = -groebnerMatrix(32,79)/(groebnerMatrix(32,65));
  groebnerMatrix(33,74) = (groebnerMatrix(17,74)/(groebnerMatrix(17,44))-groebnerMatrix(32,80)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,75) = (groebnerMatrix(17,75)/(groebnerMatrix(17,44))-groebnerMatrix(32,81)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,76) = (groebnerMatrix(17,76)/(groebnerMatrix(17,44))-groebnerMatrix(32,82)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,77) = (groebnerMatrix(17,77)/(groebnerMatrix(17,44))-groebnerMatrix(32,83)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,80) = groebnerMatrix(17,80)/(groebnerMatrix(17,44));
  groebnerMatrix(33,81) = groebnerMatrix(17,81)/(groebnerMatrix(17,44));
  groebnerMatrix(33,82) = groebnerMatrix(17,82)/(groebnerMatrix(17,44));
  groebnerMatrix(33,83) = (groebnerMatrix(17,83)/(groebnerMatrix(17,44))-groebnerMatrix(32,84)/(groebnerMatrix(32,65)));
  groebnerMatrix(33,84) = groebnerMatrix(17,84)/(groebnerMatrix(17,44));
}